

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  wally_psbt_input *parent;
  wally_psbt_output *output;
  wally_psbt_input *pwVar1;
  wally_psbt_input *pwVar2;
  wally_tx *pwVar3;
  wally_tx_output *src_00;
  wally_tx_witness_stack *p;
  wally_psbt_output *pwVar4;
  wally_psbt_output *pwVar5;
  long lVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  uchar *puVar11;
  uchar **ppuVar12;
  long lVar13;
  
  if (psbt->num_inputs != 0) {
    lVar13 = 0;
    uVar9 = 0;
    do {
      pwVar1 = psbt->inputs;
      if (pwVar1 == (wally_psbt_input *)0x0) {
        return -2;
      }
      parent = (wally_psbt_input *)((long)&pwVar1->utxo + lVar13);
      pwVar2 = src->inputs;
      pwVar3 = *(wally_tx **)((long)&pwVar2->utxo + lVar13);
      if (((pwVar3 != (wally_tx *)0x0) && (parent->utxo == (wally_tx *)0x0)) &&
         (iVar8 = wally_tx_clone_alloc(pwVar3,0,(wally_tx **)parent), iVar8 != 0)) {
        return iVar8;
      }
      if (((*(long *)((long)&pwVar1->witness_utxo + lVar13) == 0) &&
          (src_00 = *(wally_tx_output **)((long)&pwVar2->witness_utxo + lVar13),
          src_00 != (wally_tx_output *)0x0)) &&
         (iVar8 = wally_tx_output_clone_alloc
                            (src_00,(wally_tx_output **)((long)&pwVar1->witness_utxo + lVar13)),
         iVar8 != 0)) {
        return iVar8;
      }
      if ((*(long *)((long)&pwVar1->redeem_script + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->redeem_script + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->redeem_script + lVar13);
        sVar7 = *(size_t *)((long)&pwVar2->redeem_script_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar1->redeem_script_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->witness_script + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->witness_script + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->witness_script + lVar13);
        sVar7 = *(size_t *)((long)&pwVar2->witness_script_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar1->witness_script_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->final_scriptsig + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->final_scriptsig + lVar13), puVar11 != (uchar *)0x0))
      {
        ppuVar12 = (uchar **)((long)&pwVar1->final_scriptsig + lVar13);
        sVar7 = *(size_t *)((long)&pwVar2->final_scriptsig_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar1->final_scriptsig_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if (((*(long *)((long)&pwVar1->final_witness + lVar13) == 0) &&
          (p = *(wally_tx_witness_stack **)((long)&pwVar2->final_witness + lVar13),
          p != (wally_tx_witness_stack *)0x0)) &&
         (iVar8 = wally_psbt_input_set_final_witness(parent,p), iVar8 != 0)) {
        return iVar8;
      }
      iVar8 = map_extend((wally_map *)((long)&(pwVar1->keypaths).items + lVar13),
                         (wally_map *)((long)&(pwVar2->keypaths).items + lVar13),
                         wally_ec_public_key_verify);
      if (iVar8 != 0) {
        return iVar8;
      }
      iVar8 = map_extend((wally_map *)((long)&(pwVar1->signatures).items + lVar13),
                         (wally_map *)((long)&(pwVar2->signatures).items + lVar13),
                         wally_ec_public_key_verify);
      if (iVar8 != 0) {
        return iVar8;
      }
      iVar8 = map_extend((wally_map *)((long)&(pwVar1->unknowns).items + lVar13),
                         (wally_map *)((long)&(pwVar2->unknowns).items + lVar13),
                         (_func_int_uchar_ptr_size_t *)0x0);
      if (iVar8 != 0) {
        return iVar8;
      }
      if ((*(int *)((long)&pwVar1->sighash + lVar13) == 0) &&
         (iVar8 = *(int *)((long)&pwVar2->sighash + lVar13), iVar8 != 0)) {
        *(int *)((long)&pwVar1->sighash + lVar13) = iVar8;
      }
      if ((*(int *)((long)&pwVar1->has_value + lVar13) == 0) &&
         (*(int *)((long)&pwVar2->has_value + lVar13) != 0)) {
        *(undefined8 *)((long)&pwVar1->value + lVar13) =
             *(undefined8 *)((long)&pwVar2->value + lVar13);
        *(undefined4 *)((long)&pwVar1->has_value + lVar13) = 1;
      }
      if ((*(long *)((long)&pwVar1->vbf + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->vbf + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->vbf + lVar13);
        lVar6 = *(long *)((long)&pwVar2->vbf_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,(size_t *)((long)&pwVar1->vbf_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->asset + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->asset + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->asset + lVar13);
        lVar6 = *(long *)((long)&pwVar2->asset_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,(size_t *)((long)&pwVar1->asset_len + lVar13))
          ;
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->abf + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->abf + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->abf + lVar13);
        lVar6 = *(long *)((long)&pwVar2->abf_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,(size_t *)((long)&pwVar1->abf_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      pwVar3 = *(wally_tx **)((long)&pwVar2->pegin_tx + lVar13);
      if (((pwVar3 != (wally_tx *)0x0) && (*(long *)((long)&pwVar1->pegin_tx + lVar13) == 0)) &&
         (iVar8 = wally_tx_clone_alloc(pwVar3,0,(wally_tx **)((long)&pwVar1->pegin_tx + lVar13)),
         iVar8 != 0)) {
        return iVar8;
      }
      if ((*(long *)((long)&pwVar1->txoutproof + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->txoutproof + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->txoutproof + lVar13);
        sVar7 = *(size_t *)((long)&pwVar2->txoutproof_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar1->txoutproof_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->genesis_blockhash + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->genesis_blockhash + lVar13), puVar11 != (uchar *)0x0)
         ) {
        ppuVar12 = (uchar **)((long)&pwVar1->genesis_blockhash + lVar13);
        lVar6 = *(long *)((long)&pwVar2->genesis_blockhash_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,
                                (size_t *)((long)&pwVar1->genesis_blockhash_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar1->claim_script + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar2->claim_script + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar1->claim_script + lVar13);
        sVar7 = *(size_t *)((long)&pwVar2->claim_script_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar1->claim_script_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0x110;
    } while (uVar9 < psbt->num_inputs);
  }
  if (psbt->num_outputs != 0) {
    lVar13 = 0;
    uVar9 = 0;
    do {
      pwVar4 = psbt->outputs;
      pwVar5 = src->outputs;
      iVar8 = map_extend((wally_map *)((long)&(pwVar4->keypaths).items + lVar13),
                         (wally_map *)((long)&(pwVar5->keypaths).items + lVar13),
                         wally_ec_public_key_verify);
      if (iVar8 != 0) {
        return iVar8;
      }
      iVar8 = map_extend((wally_map *)((long)&(pwVar4->unknowns).items + lVar13),
                         (wally_map *)((long)&(pwVar5->unknowns).items + lVar13),
                         (_func_int_uchar_ptr_size_t *)0x0);
      if (iVar8 != 0) {
        return iVar8;
      }
      output = (wally_psbt_output *)((long)&pwVar4->redeem_script + lVar13);
      if ((output->redeem_script == (uchar *)0x0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->redeem_script + lVar13), puVar11 != (uchar *)0x0)) {
        sVar7 = *(size_t *)((long)&pwVar5->redeem_script_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          output->redeem_script = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,(uchar **)output,
                                (size_t *)((long)&pwVar4->redeem_script_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->witness_script + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->witness_script + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar4->witness_script + lVar13);
        sVar7 = *(size_t *)((long)&pwVar5->witness_script_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar4->witness_script_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->blinding_pubkey + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->blinding_pubkey + lVar13), puVar11 != (uchar *)0x0))
      {
        sVar7 = *(size_t *)((long)&pwVar5->blinding_pubkey_len + lVar13);
        if (sVar7 == 0) {
          pvVar10 = wally_malloc(1);
          *(void **)((long)&pwVar4->blinding_pubkey + lVar13) = pvVar10;
          if (pvVar10 == (void *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = wally_psbt_output_set_blinding_pubkey(output,puVar11,sVar7);
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->value_commitment + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->value_commitment + lVar13), puVar11 != (uchar *)0x0))
      {
        ppuVar12 = (uchar **)((long)&pwVar4->value_commitment + lVar13);
        lVar6 = *(long *)((long)&pwVar5->value_commitment_len + lVar13);
        if (lVar6 == 0x21) {
          iVar8 = replace_bytes(puVar11,0x21,ppuVar12,
                                (size_t *)((long)&pwVar4->value_commitment_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->vbf + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->vbf + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar4->vbf + lVar13);
        lVar6 = *(long *)((long)&pwVar5->vbf_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,(size_t *)((long)&pwVar4->vbf_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->asset_commitment + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->asset_commitment + lVar13), puVar11 != (uchar *)0x0))
      {
        ppuVar12 = (uchar **)((long)&pwVar4->asset_commitment + lVar13);
        lVar6 = *(long *)((long)&pwVar5->asset_commitment_len + lVar13);
        if (lVar6 == 0x21) {
          iVar8 = replace_bytes(puVar11,0x21,ppuVar12,
                                (size_t *)((long)&pwVar4->asset_commitment_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->abf + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->abf + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar4->abf + lVar13);
        lVar6 = *(long *)((long)&pwVar5->abf_len + lVar13);
        if (lVar6 == 0x20) {
          iVar8 = replace_bytes(puVar11,0x20,ppuVar12,(size_t *)((long)&pwVar4->abf_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->nonce + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->nonce + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar4->nonce + lVar13);
        lVar6 = *(long *)((long)&pwVar5->nonce_len + lVar13);
        if (lVar6 == 0x21) {
          iVar8 = replace_bytes(puVar11,0x21,ppuVar12,(size_t *)((long)&pwVar4->nonce_len + lVar13))
          ;
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        else {
          if (lVar6 != 0) {
            return -2;
          }
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->rangeproof + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->rangeproof + lVar13), puVar11 != (uchar *)0x0)) {
        ppuVar12 = (uchar **)((long)&pwVar4->rangeproof + lVar13);
        sVar7 = *(size_t *)((long)&pwVar5->rangeproof_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar4->rangeproof_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      if ((*(long *)((long)&pwVar4->surjectionproof + lVar13) == 0) &&
         (puVar11 = *(uchar **)((long)&pwVar5->surjectionproof + lVar13), puVar11 != (uchar *)0x0))
      {
        ppuVar12 = (uchar **)((long)&pwVar4->surjectionproof + lVar13);
        sVar7 = *(size_t *)((long)&pwVar5->surjectionproof_len + lVar13);
        if (sVar7 == 0) {
          puVar11 = (uchar *)wally_malloc(1);
          *ppuVar12 = puVar11;
          if (puVar11 == (uchar *)0x0) {
            return -3;
          }
        }
        else {
          iVar8 = replace_bytes(puVar11,sVar7,ppuVar12,
                                (size_t *)((long)&pwVar4->surjectionproof_len + lVar13));
          if (iVar8 != 0) {
            return iVar8;
          }
        }
      }
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0xd0;
    } while (uVar9 < psbt->num_outputs);
  }
  iVar8 = map_extend(&psbt->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0);
  return iVar8;
}

Assistant:

static int psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    size_t i;
    int ret = WALLY_OK;

    for (i = 0; ret == WALLY_OK && i < psbt->num_inputs; ++i)
        ret = combine_inputs(&psbt->inputs[i], &src->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < psbt->num_outputs; ++i)
        ret = combine_outputs(&psbt->outputs[i], &src->outputs[i]);

    if (ret == WALLY_OK)
        ret = map_extend(&psbt->unknowns, &src->unknowns, NULL);

    return ret;
}